

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepTiledOutputFile::breakTile
          (DeepTiledOutputFile *this,int dx,int dy,int lx,int ly,int offset,int length,char c)

{
  pthread_mutex_t *__mutex;
  uint64_t uVar1;
  OutputStreamMutex *pOVar2;
  OStream *pOVar3;
  uint64_t *puVar4;
  ostream *poVar5;
  char *pcVar6;
  ArgExc *this_00;
  int iVar7;
  bool bVar8;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  std::mutex::lock((mutex *)&__mutex->__data);
  puVar4 = TileOffsets::operator()(&this->_data->tileOffsets,dx,dy,lx,ly);
  uVar1 = *puVar4;
  if (uVar1 != 0) {
    pOVar2 = this->_data->_streamData;
    pOVar2->currentPosition = 0;
    pOVar3 = pOVar2->os;
    (*pOVar3->_vptr_OStream[4])(pOVar3,uVar1 + (long)offset);
    iVar7 = 0;
    if (0 < length) {
      iVar7 = length;
    }
    while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
      pOVar3 = this->_data->_streamData->os;
      (*pOVar3->_vptr_OStream[2])(pOVar3,&c,1);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar5 = std::operator<<(local_1a8,"Cannot overwrite tile (");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,dx);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,dy);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,lx);
  poVar5 = std::operator<<(poVar5,",");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,ly);
  poVar5 = std::operator<<(poVar5,"). The tile has not yet been stored in file \"");
  pcVar6 = fileName(this);
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::operator<<(poVar5,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepTiledOutputFile::breakTile (
    int dx, int dy, int lx, int ly, int offset, int length, char c)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    uint64_t position = _data->tileOffsets (dx, dy, lx, ly);

    if (!position)
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot overwrite tile "
            "(" << dx
                << ", " << dy << ", " << lx << "," << ly
                << "). "
                   "The tile has not yet been stored in "
                   "file \""
                << fileName () << "\".");

    _data->_streamData->currentPosition = 0;
    _data->_streamData->os->seekp (position + offset);

    for (int i = 0; i < length; ++i)
        _data->_streamData->os->write (&c, 1);
}